

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

int portability_path_is_pattern(char *path,size_t size)

{
  size_t i;
  size_t size_local;
  char *path_local;
  
  if ((path != (char *)0x0) && (size != 0)) {
    for (i = 0; path[i] != '\0' && i < size; i = i + 1) {
      if (path[i] == '*') {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int portability_path_is_pattern(const char *path, size_t size)
{
	if (path == NULL || size == 0)
	{
		return 1;
	}

	size_t i;

	for (i = 0; path[i] != '\0' && i < size; ++i)
	{
		if (path[i] == '*')
		{
			return 0;
		}
	}

	return 1;
}